

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O2

void __thiscall OPL3::OPL3(OPL3 *this,bool fullpan)

{
  int iVar1;
  OPL3DataStruct *this_00;
  OperatorDataStruct *this_01;
  undefined3 in_register_00000031;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_006e9408;
  (this->disabledChannel).super_Channel.cnt = 0;
  (this->disabledChannel).super_Channel.channelBaseAddress = 0;
  (this->disabledChannel).super_Channel.feedback[0] = 0.0;
  (this->disabledChannel).super_Channel.feedback[1] = 0.0;
  (this->disabledChannel).super_Channel.fnuml = 0;
  (this->disabledChannel).super_Channel.fnumh = 0;
  (this->disabledChannel).super_Channel.kon = 0;
  (this->disabledChannel).super_Channel.block = 0;
  (this->disabledChannel).super_Channel.fb = 0;
  (this->disabledChannel).super_Channel.leftPan = 0.0;
  (this->disabledChannel).super_Channel.rightPan = 0.0;
  (this->disabledChannel).super_Channel._vptr_Channel = (_func_int **)&PTR__Channel_006e9610;
  HighHatOperator::HighHatOperator(&this->highHatOperator);
  SnareDrumOperator::SnareDrumOperator(&this->snareDrumOperator);
  TomTomOperator::TomTomOperator(&this->tomTomOperator);
  if (CONCAT31(in_register_00000031,fullpan) == 0) {
    uVar3 = 0;
    uVar4 = 0x3ff00000;
  }
  else {
    uVar3 = 0x667e556e;
    uVar4 = 0x3fe6a09e;
  }
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.cnt = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.
  channelBaseAddress = 8;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[0] =
       0.0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[1] =
       0.0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fb = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnuml = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnumh = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.kon = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.block = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.rightPan =
       (double)CONCAT44(uVar4,uVar3);
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.leftPan =
       (double)CONCAT44(uVar4,uVar3);
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.op1 =
       &(this->tomTomOperator).super_Operator;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.op2 =
       &(this->topCymbalOperator).super_Operator;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel._vptr_Channel =
       (_func_int **)&PTR__Channel_006e9668;
  BassDrumChannel::BassDrumChannel(&this->bassDrumChannel,(double)CONCAT44(uVar4,uVar3));
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.cnt = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.
  channelBaseAddress = 7;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fb = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[0] =
       0.0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[1] =
       0.0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnuml = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnumh = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.kon = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.block = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.rightPan =
       (double)CONCAT44(uVar4,uVar3);
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.leftPan =
       (double)CONCAT44(uVar4,uVar3);
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.op1 =
       (Operator *)&this->highHatOperator;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.op2 =
       &(this->snareDrumOperator).super_Operator;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel._vptr_Channel =
       (_func_int **)&PTR__Channel_006e96c0;
  TopCymbalOperator::TopCymbalOperator(&this->topCymbalOperator);
  this->FullPan = fullpan;
  this->nts = 0;
  this->dam = 0;
  this->dvb = 0;
  this->ryt = 0;
  this->bd = 0;
  this->sd = 0;
  this->tom = 0;
  this->tc = 0;
  this->hh = 0;
  this->_new = 0;
  this->connectionsel = 0;
  this->vibratoIndex = 0;
  this->tremoloIndex = 0;
  iVar1 = InstanceCount + 1;
  bVar2 = InstanceCount == 0;
  InstanceCount = iVar1;
  if (bVar2) {
    this_00 = (OPL3DataStruct *)operator_new(0x547c0);
    OPL3DataStruct::OPL3DataStruct(this_00);
    OPL3Data = this_00;
    this_01 = (OperatorDataStruct *)operator_new(0x11c00);
    OperatorDataStruct::OperatorDataStruct(this_01);
    OperatorData = this_01;
  }
  initOperators(this);
  initChannels2op(this);
  initChannels4op(this);
  initChannels(this);
  return;
}

Assistant:

OPL3::OPL3(bool fullpan)
: tomTomTopCymbalChannel(fullpan ? CENTER_PANNING_POWER : 1, &tomTomOperator, &topCymbalOperator),
  bassDrumChannel(fullpan ? CENTER_PANNING_POWER : 1),
  highHatSnareDrumChannel(fullpan ? CENTER_PANNING_POWER : 1, &highHatOperator, &snareDrumOperator)
{
	FullPan = fullpan;
    nts = dam = dvb = ryt = bd = sd = tom = tc = hh = _new = connectionsel = 0;
    vibratoIndex = tremoloIndex = 0; 

	if (InstanceCount++ == 0)
	{
		OPL3Data = new struct OPL3DataStruct;
		OperatorData = new struct OperatorDataStruct;
	}

    initOperators();
    initChannels2op();
    initChannels4op();
    initRhythmChannels();
    initChannels();
}